

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

google_protobuf_FeatureSet *
google_protobuf_MessageOptions_features(google_protobuf_MessageOptions *msg)

{
  google_protobuf_MessageOptions *to;
  upb_MiniTableField *f;
  _Bool _Var1;
  void *from;
  undefined1 local_4c [8];
  upb_MiniTableField field;
  google_protobuf_FeatureSet *ret;
  google_protobuf_FeatureSet *default_val;
  google_protobuf_MessageOptions *msg_local;
  google_protobuf_FeatureSet **local_20;
  upb_MiniTableField *local_18;
  google_protobuf_FeatureSet *local_10;
  
  ret = (google_protobuf_FeatureSet *)0x0;
  local_4c._0_4_ = 0xc;
  local_4c._4_2_ = 0x10;
  local_4c._6_2_ = 0x45;
  field.number_dont_copy_me__upb_internal_use_only = 0xc20b0000;
  default_val = (google_protobuf_FeatureSet *)msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&google__protobuf__FeatureSet_msg_init);
  local_10 = default_val;
  local_18 = (upb_MiniTableField *)local_4c;
  local_20 = &ret;
  msg_local = (google_protobuf_MessageOptions *)&field.offset_dont_copy_me__upb_internal_use_only;
  _Var1 = upb_MiniTableField_IsExtension(local_18);
  if (_Var1) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsInOneof(local_18);
  if (((_Var1) ||
      (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(local_18,local_20)
      , !_Var1)) &&
     (_Var1 = upb_Message_HasBaseField(&local_10->base_dont_copy_me__upb_internal_use_only,local_18)
     , !_Var1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
    return (google_protobuf_FeatureSet *)field._4_8_;
  }
  f = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&local_10->base_dont_copy_me__upb_internal_use_only,local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,from);
  return (google_protobuf_FeatureSet *)field._4_8_;
}

Assistant:

UPB_INLINE const google_protobuf_FeatureSet* google_protobuf_MessageOptions_features(const google_protobuf_MessageOptions* msg) {
  const google_protobuf_FeatureSet* default_val = NULL;
  const google_protobuf_FeatureSet* ret;
  const upb_MiniTableField field = {12, 16, 69, 0, 11, (int)kUpb_FieldMode_Scalar | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__FeatureSet_msg_init);
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}